

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O2

vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
* hwtest::pgraph::pgraph_debug_regs
            (vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
             *__return_storage_ptr__,chipset_info *chipset)

{
  int iVar1;
  Register *pRVar2;
  SimpleMmioRegister *pSVar3;
  uint32_t uVar4;
  string *psVar5;
  allocator local_431;
  _Head_base<0UL,_hwtest::pgraph::Register_*,_false> local_430;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = chipset->card_type;
  if (iVar1 == 0x30) {
    pRVar2 = (Register *)operator_new(0x40);
    DebugBRegister::DebugBRegister((DebugBRegister *)pRVar2,0x400084,0x7012f7c1);
    local_430._M_head_impl = pRVar2;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if (local_430._M_head_impl != (Register *)0x0) {
      (*(((SimpleMmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_MmioRegister).
        super_Register._vptr_Register[1])();
    }
    pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_2c8,"DEBUG_D",&local_431);
    SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x40008c,0xfffedf7d,&local_2c8,0x2c,0);
    local_430._M_head_impl = (Register *)pSVar3;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
      (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
        [1])();
    }
    local_430._M_head_impl = (Register *)0x0;
    std::__cxx11::string::~string((string *)&local_2c8);
    pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_2e8,"DEBUG_E",&local_431);
    SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x400090,0x3fffffff,&local_2e8,0x30,0);
    local_430._M_head_impl = (Register *)pSVar3;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
      (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
        [1])();
    }
    local_430._M_head_impl = (Register *)0x0;
    std::__cxx11::string::~string((string *)&local_2e8);
    pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_308,"DEBUG_G",&local_431);
    SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x400098,0xffffffff,&local_308,0x38,0);
    local_430._M_head_impl = (Register *)pSVar3;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
      (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
        [1])();
    }
    local_430._M_head_impl = (Register *)0x0;
    std::__cxx11::string::~string((string *)&local_308);
    pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_328,"DEBUG_H",&local_431);
    SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x40009c,0xffffffff,&local_328,0x3c,0);
    local_430._M_head_impl = (Register *)pSVar3;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
      (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
        [1])();
    }
    local_430._M_head_impl = (Register *)0x0;
    std::__cxx11::string::~string((string *)&local_328);
    pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_348,"DEBUG_I",&local_431);
    SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x4000a0,0xffffffff,&local_348,0x44,0);
    local_430._M_head_impl = (Register *)pSVar3;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
      (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
        [1])();
    }
    local_430._M_head_impl = (Register *)0x0;
    std::__cxx11::string::~string((string *)&local_348);
    pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_368,"DEBUG_J",&local_431);
    SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x4000a4,0xf,&local_368,0x48,0);
    local_430._M_head_impl = (Register *)pSVar3;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
      (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
        [1])();
    }
    local_430._M_head_impl = (Register *)0x0;
    std::__cxx11::string::~string((string *)&local_368);
    pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_388,"DEBUG_L",&local_431);
    SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x4000c0,0x1e,&local_388,0x50,0);
    local_430._M_head_impl = (Register *)pSVar3;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
      (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
        [1])();
    }
    psVar5 = &local_388;
    goto LAB_0017b314;
  }
  if (iVar1 == 3) {
    pRVar2 = (Register *)operator_new(0x40);
    Nv1DebugARegister::Nv1DebugARegister((Nv1DebugARegister *)pRVar2,0x400080,0x13311110);
    local_430._M_head_impl = pRVar2;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if (local_430._M_head_impl != (Register *)0x0) {
      (*(((SimpleMmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_MmioRegister).
        super_Register._vptr_Register[1])();
    }
    pRVar2 = (Register *)operator_new(0x40);
    DebugBRegister::DebugBRegister((DebugBRegister *)pRVar2,0x400084,0x10113301);
    local_430._M_head_impl = pRVar2;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if (local_430._M_head_impl != (Register *)0x0) {
      (*(((SimpleMmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_MmioRegister).
        super_Register._vptr_Register[1])();
    }
    pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_88,"DEBUG_C",&local_431);
    SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x400088,0x1133f111,&local_88,0x28,0);
    local_430._M_head_impl = (Register *)pSVar3;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
      (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
        [1])();
    }
    local_430._M_head_impl = (Register *)0x0;
    std::__cxx11::string::~string((string *)&local_88);
    pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_a8,"DEBUG_D",&local_431);
    SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x40008c,0x1173ff31,&local_a8,0x2c,0);
    local_430._M_head_impl = (Register *)pSVar3;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
      (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
        [1])();
    }
    psVar5 = &local_a8;
    goto LAB_0017b314;
  }
  if (iVar1 == 4) {
    iVar1 = chipset->chipset;
    pRVar2 = (Register *)operator_new(0x40);
    Nv4DebugARegister::Nv4DebugARegister((Nv4DebugARegister *)pRVar2,0x400080,0x1337f000);
    local_430._M_head_impl = pRVar2;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if (local_430._M_head_impl != (Register *)0x0) {
      (*(((SimpleMmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_MmioRegister).
        super_Register._vptr_Register[1])();
    }
    pRVar2 = (Register *)operator_new(0x40);
    uVar4 = 0x72113101;
    if (4 < iVar1) {
      uVar4 = 0xf2ffb701;
    }
    DebugBRegister::DebugBRegister((DebugBRegister *)pRVar2,0x400084,uVar4);
    local_430._M_head_impl = pRVar2;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if (local_430._M_head_impl != (Register *)0x0) {
      (*(((SimpleMmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_MmioRegister).
        super_Register._vptr_Register[1])();
    }
    pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_c8,"DEBUG_C",&local_431);
    SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x400088,0x11d7fff1,&local_c8,0x28,0);
    local_430._M_head_impl = (Register *)pSVar3;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
      (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
        [1])();
    }
    local_430._M_head_impl = (Register *)0x0;
    std::__cxx11::string::~string((string *)&local_c8);
    pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_e8,"DEBUG_D",&local_431);
    uVar4 = 0x11ffff33;
    if (4 < iVar1) {
      uVar4 = 0xfbffff73;
    }
    SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x40008c,uVar4,&local_e8,0x2c,0);
    local_430._M_head_impl = (Register *)pSVar3;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
      (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
        [1])();
    }
    psVar5 = &local_e8;
    goto LAB_0017b314;
  }
  if (iVar1 != 0x10) {
    if (iVar1 == 0x20) {
      iVar1 = chipset->chipset;
      pRVar2 = (Register *)operator_new(0x40);
      DebugBRegister::DebugBRegister((DebugBRegister *)pRVar2,0x400084,0x11f7c1);
      local_430._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if (local_430._M_head_impl != (Register *)0x0) {
        (*(((SimpleMmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_MmioRegister).
          super_Register._vptr_Register[1])();
      }
      if (iVar1 < 0x25 || iVar1 == 0x2a) {
        pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
        std::__cxx11::string::string((string *)&local_1c8,"DEBUG_D",&local_431);
        SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x40008c,0xffffd77d,&local_1c8,0x2c,0);
        local_430._M_head_impl = (Register *)pSVar3;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_430);
        if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
          (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
            _vptr_Register[1])();
        }
        local_430._M_head_impl = (Register *)0x0;
        std::__cxx11::string::~string((string *)&local_1c8);
        pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
        std::__cxx11::string::string((string *)&local_1e8,"DEBUG_E",&local_431);
        SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x400090,0xfffff3ff,&local_1e8,0x30,0);
        local_430._M_head_impl = (Register *)pSVar3;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_430);
        if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
          (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
            _vptr_Register[1])();
        }
        local_430._M_head_impl = (Register *)0x0;
        std::__cxx11::string::~string((string *)&local_1e8);
        pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
        std::__cxx11::string::string((string *)&local_208,"DEBUG_F",&local_431);
        SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x400094,0xff,&local_208,0x34,0);
        local_430._M_head_impl = (Register *)pSVar3;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_430);
        if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
          (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
            _vptr_Register[1])();
        }
        psVar5 = &local_208;
      }
      else {
        pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
        std::__cxx11::string::string((string *)&local_228,"DEBUG_D",&local_431);
        SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x40008c,0xffffdf7d,&local_228,0x2c,0);
        local_430._M_head_impl = (Register *)pSVar3;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_430);
        if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
          (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
            _vptr_Register[1])();
        }
        local_430._M_head_impl = (Register *)0x0;
        std::__cxx11::string::~string((string *)&local_228);
        pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
        std::__cxx11::string::string((string *)&local_248,"DEBUG_E",&local_431);
        SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x400090,0xffffffff,&local_248,0x30,0);
        local_430._M_head_impl = (Register *)pSVar3;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_430);
        if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
          (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
            _vptr_Register[1])();
        }
        psVar5 = &local_248;
      }
      local_430._M_head_impl = (Register *)0x0;
      std::__cxx11::string::~string((string *)psVar5);
      pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
      std::__cxx11::string::string((string *)&local_268,"DEBUG_G",&local_431);
      SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x400098,0xffffffff,&local_268,0x38,0);
      local_430._M_head_impl = (Register *)pSVar3;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
        (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
          _vptr_Register[1])();
      }
      local_430._M_head_impl = (Register *)0x0;
      std::__cxx11::string::~string((string *)&local_268);
      pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
      std::__cxx11::string::string((string *)&local_288,"DEBUG_FD_CHECK_SKIP",&local_431);
      SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x40009c,0xfff,&local_288,0x40,0);
      local_430._M_head_impl = (Register *)pSVar3;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
        (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
          _vptr_Register[1])();
      }
      local_430._M_head_impl = (Register *)0x0;
      std::__cxx11::string::~string((string *)&local_288);
      if (iVar1 < 0x25 || iVar1 == 0x2a) {
        return __return_storage_ptr__;
      }
      pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
      std::__cxx11::string::string((string *)&local_2a8,"DEBUG_L",&local_431);
      SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x4000c0,3,&local_2a8,0x50,0);
      local_430._M_head_impl = (Register *)pSVar3;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
        (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
          _vptr_Register[1])();
      }
      psVar5 = &local_2a8;
    }
    else if (iVar1 == 1) {
      pRVar2 = (Register *)operator_new(0x40);
      Nv1DebugARegister::Nv1DebugARegister((Nv1DebugARegister *)pRVar2,0x400080,0x11111110);
      local_430._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if (local_430._M_head_impl != (Register *)0x0) {
        (*(((SimpleMmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_MmioRegister).
          super_Register._vptr_Register[1])();
      }
      pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
      std::__cxx11::string::string((string *)&local_48,"DEBUG_B",&local_431);
      SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x400084,0x31111101,&local_48,0x24,0);
      local_430._M_head_impl = (Register *)pSVar3;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
        (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
          _vptr_Register[1])();
      }
      local_430._M_head_impl = (Register *)0x0;
      std::__cxx11::string::~string((string *)&local_48);
      pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
      std::__cxx11::string::string((string *)&local_68,"DEBUG_C",&local_431);
      SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x400088,0x11111111,&local_68,0x28,0);
      local_430._M_head_impl = (Register *)pSVar3;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
        (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
          _vptr_Register[1])();
      }
      psVar5 = &local_68;
    }
    else {
      pRVar2 = (Register *)operator_new(0x40);
      DebugBRegister::DebugBRegister((DebugBRegister *)pRVar2,0x400084,0x7010c7c1);
      local_430._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if (local_430._M_head_impl != (Register *)0x0) {
        (*(((SimpleMmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_MmioRegister).
          super_Register._vptr_Register[1])();
      }
      pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
      std::__cxx11::string::string((string *)&local_3a8,"DEBUG_D",&local_431);
      SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x40008c,0xe1fad155,&local_3a8,0x2c,0);
      local_430._M_head_impl = (Register *)pSVar3;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
        (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
          _vptr_Register[1])();
      }
      local_430._M_head_impl = (Register *)0x0;
      std::__cxx11::string::~string((string *)&local_3a8);
      pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
      std::__cxx11::string::string((string *)&local_3c8,"DEBUG_E",&local_431);
      SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x400090,0x33ffffff,&local_3c8,0x30,0);
      local_430._M_head_impl = (Register *)pSVar3;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
        (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
          _vptr_Register[1])();
      }
      local_430._M_head_impl = (Register *)0x0;
      std::__cxx11::string::~string((string *)&local_3c8);
      pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
      std::__cxx11::string::string((string *)&local_3e8,"DEBUG_J",&local_431);
      SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x4000a4,0xf,&local_3e8,0x48,0);
      local_430._M_head_impl = (Register *)pSVar3;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
        (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
          _vptr_Register[1])();
      }
      local_430._M_head_impl = (Register *)0x0;
      std::__cxx11::string::~string((string *)&local_3e8);
      pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
      std::__cxx11::string::string((string *)&local_408,"DEBUG_K",&local_431);
      SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x4000b0,0x3f,&local_408,0x4c,0);
      local_430._M_head_impl = (Register *)pSVar3;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
        (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
          _vptr_Register[1])();
      }
      local_430._M_head_impl = (Register *)0x0;
      std::__cxx11::string::~string((string *)&local_408);
      pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
      std::__cxx11::string::string((string *)&local_428,"DEBUG_L",&local_431);
      SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x4000c0,6,&local_428,0x50,0);
      local_430._M_head_impl = (Register *)pSVar3;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
        (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
          _vptr_Register[1])();
      }
      psVar5 = &local_428;
    }
    goto LAB_0017b314;
  }
  iVar1 = chipset->chipset;
  if (iVar1 < 0x11 || iVar1 == 0x15) {
    pRVar2 = (Register *)operator_new(0x40);
    CelsiusDebugBRegister::DebugBRegister((CelsiusDebugBRegister *)pRVar2,0x400084,0xfe11f701);
    local_430._M_head_impl = pRVar2;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
  }
  else {
    pRVar2 = (Register *)operator_new(0x40);
    CelsiusDebugBRegister::DebugBRegister((CelsiusDebugBRegister *)pRVar2,0x400084,0xfe71f701);
    local_430._M_head_impl = pRVar2;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
  }
  if (local_430._M_head_impl != (Register *)0x0) {
    (*(((DebugBRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_SimpleMmioRegister).
      super_MmioRegister.super_Register._vptr_Register[1])();
  }
  pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
  std::__cxx11::string::string((string *)&local_108,"DEBUG_C",&local_431);
  SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x400088,0xffffffff,&local_108,0x28,0);
  local_430._M_head_impl = (Register *)pSVar3;
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
  ::
  emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
            ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
              *)__return_storage_ptr__,
             (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *
             )&local_430);
  if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
    (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
      [1])();
  }
  local_430._M_head_impl = (Register *)0x0;
  std::__cxx11::string::~string((string *)&local_108);
  if (iVar1 < 0x11) {
    pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_128,"DEBUG_D",&local_431);
    SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x40008c,0xfffffc70,&local_128,0x2c,0);
    local_430._M_head_impl = (Register *)pSVar3;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
      (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
        [1])();
    }
    local_430._M_head_impl = (Register *)0x0;
    std::__cxx11::string::~string((string *)&local_128);
    if (iVar1 < 0x17 || iVar1 == 0x1a) goto LAB_0017b2a1;
  }
  else {
    if (iVar1 < 0x17 || iVar1 == 0x1a) {
      pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
      std::__cxx11::string::string((string *)&local_148,"DEBUG_D",&local_431);
      SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x40008c,0xffffff78,&local_148,0x2c,0);
      local_430._M_head_impl = (Register *)pSVar3;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
        (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
          _vptr_Register[1])();
      }
      local_430._M_head_impl = (Register *)0x0;
      std::__cxx11::string::~string((string *)&local_148);
LAB_0017b2a1:
      pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
      std::__cxx11::string::string((string *)&local_188,"DEBUG_E",&local_431);
      SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x400090,0xffffff,&local_188,0x30,0);
      local_430._M_head_impl = (Register *)pSVar3;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_430);
      if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
        (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register).
          _vptr_Register[1])();
      }
      psVar5 = &local_188;
      goto LAB_0017b314;
    }
    pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_168,"DEBUG_D",&local_431);
    SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x40008c,0xffffff78,&local_168,0x2c,0x400);
    local_430._M_head_impl = (Register *)pSVar3;
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
    ::
    emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
              ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                *)__return_storage_ptr__,
               (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                *)&local_430);
    if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
      (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
        [1])();
    }
    local_430._M_head_impl = (Register *)0x0;
    std::__cxx11::string::~string((string *)&local_168);
  }
  pSVar3 = (SimpleMmioRegister *)operator_new(0x40);
  std::__cxx11::string::string((string *)&local_1a8,"DEBUG_E",&local_431);
  SimpleMmioRegister::SimpleMmioRegister(pSVar3,0x400090,0x1fffffff,&local_1a8,0x30,0);
  local_430._M_head_impl = (Register *)pSVar3;
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
  ::
  emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
            ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
              *)__return_storage_ptr__,
             (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *
             )&local_430);
  if ((SimpleMmioRegister *)local_430._M_head_impl != (SimpleMmioRegister *)0x0) {
    (*(((MmioRegister *)&(local_430._M_head_impl)->_vptr_Register)->super_Register)._vptr_Register
      [1])();
  }
  psVar5 = &local_1a8;
LAB_0017b314:
  local_430._M_head_impl = (Register *)0x0;
  std::__cxx11::string::~string((string *)psVar5);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<Register>> pgraph_debug_regs(const chipset_info &chipset) {
	std::vector<std::unique_ptr<Register>> res;
	if (chipset.card_type == 1) {
		AREG(Nv1DebugARegister, 0x400080, 0x11111110);
		REG(0x400084, 0x31111101, "DEBUG_B", debug_b);
		REG(0x400088, 0x11111111, "DEBUG_C", debug_c);
	} else if (chipset.card_type == 3) {
		AREG(Nv1DebugARegister, 0x400080, 0x13311110);
		AREG(DebugBRegister, 0x400084, 0x10113301);
		REG(0x400088, 0x1133f111, "DEBUG_C", debug_c);
		REG(0x40008c, 0x1173ff31, "DEBUG_D", debug_d);
	} else if (chipset.card_type == 4) {
		bool is_nv5 = chipset.chipset >= 5;
		AREG(Nv4DebugARegister, 0x400080, 0x1337f000);
		AREG(DebugBRegister, 0x400084, (is_nv5 ? 0xf2ffb701 : 0x72113101));
		REG(0x400088, 0x11d7fff1, "DEBUG_C", debug_c);
		REG(0x40008c, (is_nv5 ? 0xfbffff73 : 0x11ffff33), "DEBUG_D", debug_d);
	} else if (chipset.card_type == 0x10) {
		bool is_nv11p = nv04_pgraph_is_nv11p(&chipset);
		bool is_nv15p = nv04_pgraph_is_nv15p(&chipset);
		bool is_nv17p = nv04_pgraph_is_nv17p(&chipset);
		// XXX DEBUG_A
		if (!is_nv11p) {
			AREG(CelsiusDebugBRegister, 0x400084, 0xfe11f701);
		} else {
			AREG(CelsiusDebugBRegister, 0x400084, 0xfe71f701);
		}
		REG(0x400088, 0xffffffff, "DEBUG_C", debug_c);
		if (!is_nv15p) {
			REG(0x40008c, 0xfffffc70, "DEBUG_D", debug_d);
		} else if (!is_nv17p) {
			REG(0x40008c, 0xffffff78, "DEBUG_D", debug_d);
		} else {
			REGF(0x40008c, 0xffffff78, "DEBUG_D", debug_d, 0x400);
		}
		if (!is_nv17p) {
			REG(0x400090, 0x00ffffff, "DEBUG_E", debug_e);
		} else {
			REG(0x400090, 0x1fffffff, "DEBUG_E", debug_e);
		}
	} else if (chipset.card_type == 0x20) {
		bool is_nv25p = nv04_pgraph_is_nv25p(&chipset);
		// XXX DEBUG_A
		AREG(DebugBRegister, 0x400084, 0x0011f7c1);
		if (!is_nv25p) {
			REG(0x40008c, 0xffffd77d, "DEBUG_D", debug_d);
			REG(0x400090, 0xfffff3ff, "DEBUG_E", debug_e);
			REG(0x400094, 0x000000ff, "DEBUG_F", debug_f);
		} else {
			REG(0x40008c, 0xffffdf7d, "DEBUG_D", debug_d);
			REG(0x400090, 0xffffffff, "DEBUG_E", debug_e);
		}
		REG(0x400098, 0xffffffff, "DEBUG_G", debug_g);
		REG(0x40009c, 0x00000fff, "DEBUG_FD_CHECK_SKIP", debug_fd_check_skip);
		if (is_nv25p) {
			REG(0x4000c0, 0x00000003, "DEBUG_L", debug_l);
		}
	} else if (chipset.card_type == 0x30) {
		// XXX DEBUG_A
		AREG(DebugBRegister, 0x400084, 0x7012f7c1);
		REG(0x40008c, 0xfffedf7d, "DEBUG_D", debug_d);
		REG(0x400090, 0x3fffffff, "DEBUG_E", debug_e);
		REG(0x400098, 0xffffffff, "DEBUG_G", debug_g);
		REG(0x40009c, 0xffffffff, "DEBUG_H", debug_h);
		REG(0x4000a0, 0xffffffff, "DEBUG_I", debug_i);
		REG(0x4000a4, 0x0000000f, "DEBUG_J", debug_j);
		REG(0x4000c0, 0x0000001e, "DEBUG_L", debug_l);
	} else {
		// XXX DEBUG_A
		AREG(DebugBRegister, 0x400084, 0x7010c7c1);
		REG(0x40008c, 0xe1fad155, "DEBUG_D", debug_d);
		REG(0x400090, 0x33ffffff, "DEBUG_E", debug_e);
		REG(0x4000a4, 0x0000000f, "DEBUG_J", debug_j);
		REG(0x4000b0, 0x0000003f, "DEBUG_K", debug_k);
		REG(0x4000c0, 0x00000006, "DEBUG_L", debug_l);
	}
	return res;
}